

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl::~RpcServerResponseImpl
          (RpcServerResponseImpl *this)

{
  HashBucket *pHVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  Entry *pEVar4;
  RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *pRVar5;
  Entry *pEVar6;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar7;
  RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *pRVar8;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *pMVar9;
  OutgoingRpcMessage *pOVar10;
  Disposer *pDVar11;
  
  pHVar1 = (this->resolutionsAtReturnTime).table.indexes.buckets.ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = (this->resolutionsAtReturnTime).table.indexes.buckets.size_;
    (this->resolutionsAtReturnTime).table.indexes.buckets.ptr = (HashBucket *)0x0;
    (this->resolutionsAtReturnTime).table.indexes.buckets.size_ = 0;
    pAVar3 = (this->resolutionsAtReturnTime).table.indexes.buckets.disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pHVar1,8,sVar2,sVar2,0);
  }
  pEVar4 = (this->resolutionsAtReturnTime).table.rows.builder.ptr;
  if (pEVar4 != (Entry *)0x0) {
    pRVar5 = (this->resolutionsAtReturnTime).table.rows.builder.pos;
    pEVar6 = (this->resolutionsAtReturnTime).table.rows.builder.endPtr;
    (this->resolutionsAtReturnTime).table.rows.builder.ptr = (Entry *)0x0;
    (this->resolutionsAtReturnTime).table.rows.builder.pos =
         (RemoveConst<kj::HashMap<unsigned_long,_capnp::InterfaceSchema>::Entry> *)0x0;
    (this->resolutionsAtReturnTime).table.rows.builder.endPtr = (Entry *)0x0;
    pAVar3 = (this->resolutionsAtReturnTime).table.rows.builder.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pEVar4,0x18,((long)pRVar5 - (long)pEVar4 >> 3) * -0x5555555555555555,
               ((long)pEVar6 - (long)pEVar4 >> 3) * -0x5555555555555555,
               kj::ArrayDisposer::
               Dispose_<kj::HashMap<capnp::ClientHook_*,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry>
               ::destruct);
  }
  (this->capTable).super_CapTableBuilder.super_CapTableReader._vptr_CapTableReader =
       (_func_int **)&PTR_extractCap_006f77b0;
  pMVar7 = (this->capTable).table.builder.ptr;
  if (pMVar7 != (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0) {
    pRVar8 = (this->capTable).table.builder.pos;
    pMVar9 = (this->capTable).table.builder.endPtr;
    (this->capTable).table.builder.ptr = (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    (this->capTable).table.builder.pos = (RemoveConst<kj::Maybe<kj::Own<capnp::ClientHook>_>_> *)0x0
    ;
    (this->capTable).table.builder.endPtr =
         (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)0x0;
    pAVar3 = (this->capTable).table.builder.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,pMVar7,0x10,(long)pRVar8 - (long)pMVar7 >> 4,(long)pMVar9 - (long)pMVar7 >> 4,
               kj::ArrayDisposer::Dispose_<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>
               ::destruct);
  }
  pOVar10 = (this->message).ptr;
  if (pOVar10 != (OutgoingRpcMessage *)0x0) {
    (this->message).ptr = (OutgoingRpcMessage *)0x0;
    pDVar11 = (this->message).disposer;
    (**pDVar11->_vptr_Disposer)
              (pDVar11,pOVar10->_vptr_OutgoingRpcMessage[-2] +
                       (long)&pOVar10->_vptr_OutgoingRpcMessage);
    return;
  }
  return;
}

Assistant:

RpcServerResponseImpl(RpcConnectionState& connectionState,
                          kj::Own<OutgoingRpcMessage>&& message,
                          rpc::Payload::Builder payload)
        : connectionState(connectionState),
          message(kj::mv(message)),
          payload(payload) {}